

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macros.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Disa::console_format_abi_cxx11_
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Disa *this,Log_Level level,source_location *location)

{
  size_type sVar1;
  undefined7 in_register_00000011;
  long *plVar2;
  uint __val;
  char *__s;
  char *__s_00;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  plVar2 = (long *)CONCAT71(in_register_00000011,level);
  __s_00 = "";
  __s = "";
  if ((undefined8 *)*plVar2 != (undefined8 *)0x0) {
    __s = *(char **)*plVar2;
  }
  suffix._M_dataplus._M_p = (pointer)strlen(__s);
  suffix._M_string_length = (size_type)__s;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    ((basic_string_view<char,_std::char_traits<char>_> *)&suffix,'/',
                     0xffffffffffffffff);
  if ((undefined8 *)*plVar2 != (undefined8 *)0x0) {
    __s_00 = *(char **)*plVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s_00,&local_e9);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_a8,&local_48,sVar1 + 1,0xffffffffffffffff);
  std::operator+(&local_88,&local_a8,"::");
  if (*plVar2 == 0) {
    __val = 0;
  }
  else {
    __val = *(uint *)(*plVar2 + 0x10);
  }
  std::__cxx11::to_string(&local_68,__val);
  std::operator+(&local_e8,&local_88,&local_68);
  std::operator+(&suffix,&local_e8,"]: ");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  switch((ulong)this & 0xff) {
  case 0:
    std::__cxx11::string::string((string *)&local_e8,&suffix);
    std::operator+(__return_storage_ptr__,"[Error|",&local_e8);
    break;
  case 1:
    std::__cxx11::string::string((string *)&local_e8,&suffix);
    std::operator+(__return_storage_ptr__,"[Warn |",&local_e8);
    break;
  case 2:
    std::__cxx11::string::string((string *)&local_e8,&suffix);
    std::operator+(__return_storage_ptr__,"[Info |",&local_e8);
    break;
  case 3:
    std::__cxx11::string::string((string *)&local_e8,&suffix);
    std::operator+(__return_storage_ptr__,"[Debug|",&local_e8);
    break;
  default:
    std::__cxx11::string::string((string *)&local_a8,&suffix);
    std::operator+(&local_88,"[Error|",&local_a8);
    std::operator+(&local_e8,&local_88," Unrecognised log level parsed.");
    std::operator<<((ostream *)&std::cout,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    exit(1);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&suffix);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<char> console_format(const Log_Level level, const std::source_location& location) {
  auto const iter = std::basic_string_view<char>(location.file_name()).find_last_of('/');
  const auto suffix =
  std::basic_string<char>(location.file_name()).substr(iter + 1) + "::" + std::to_string(location.line()) + "]: ";
  switch(level) {
    case Log_Level::Debug:
      return "[Debug|" + std::basic_string(suffix);
    case Log_Level::Info:
      return "[Info |" + std::basic_string(suffix);
    case Log_Level::Warning:
      return "[Warn |" + std::basic_string(suffix);
    case Log_Level::Error:
      return "[Error|" + std::basic_string(suffix);
    default:
      std::cout << "[Error|" + std::basic_string(suffix) + " Unrecognised log level parsed.";
      exit(1);
  }
}